

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O3

bool __thiscall Options::push_expect_var(Options *this,string_view *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  _Alloc_hider __nptr;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  int *piVar7;
  undefined8 uVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  uint local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Options *local_40;
  pointer local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar12 = false;
  bVar3 = false;
  local_7c = local_7c & 0xffffff00;
  local_40 = this;
  if (info->__size != 0) {
    pcVar11 = info->__data;
    pcVar6 = pcVar11 + info->__size;
    paVar1 = &local_78.field_2;
    bVar12 = false;
    do {
      lVar10 = (long)pcVar6 - (long)pcVar11 >> 2;
      pcVar4 = pcVar11;
      if (0 < lVar10) {
        lVar10 = lVar10 + 1;
        pcVar9 = pcVar11 + 3;
        do {
          if ((pcVar9[-3] == ',') || (pcVar9[-3] == ':')) {
            pcVar9 = pcVar9 + -3;
            goto LAB_001a12e1;
          }
          if ((pcVar9[-2] == ',') || (pcVar9[-2] == ':')) {
            pcVar9 = pcVar9 + -2;
            goto LAB_001a12e1;
          }
          if ((pcVar9[-1] == ',') || (pcVar9[-1] == ':')) {
            pcVar9 = pcVar9 + -1;
            goto LAB_001a12e1;
          }
          if ((*pcVar9 == ',') || (*pcVar9 == ':')) goto LAB_001a12e1;
          lVar10 = lVar10 + -1;
          pcVar9 = pcVar9 + 4;
          pcVar4 = pcVar11 + ((long)pcVar6 - (long)pcVar11 & 0xfffffffffffffffc);
        } while (1 < lVar10);
      }
      pcVar9 = pcVar4;
      lVar10 = (long)pcVar6 - (long)pcVar9;
      if (lVar10 == 1) {
LAB_001a12bc:
        if ((*pcVar9 != ',') && (*pcVar9 != ':')) goto LAB_001a1478;
      }
      else if (lVar10 == 2) {
LAB_001a12ab:
        if ((*pcVar9 != ',') && (*pcVar9 != ':')) {
          pcVar9 = pcVar9 + 1;
          goto LAB_001a12bc;
        }
      }
      else {
        if (lVar10 != 3) goto LAB_001a1478;
        if ((*pcVar9 != ',') && (*pcVar9 != ':')) {
          pcVar9 = pcVar9 + 1;
          goto LAB_001a12ab;
        }
      }
LAB_001a12e1:
      if ((pcVar9 == pcVar6) || (pcVar11 == pcVar9)) goto LAB_001a147b;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar11,pcVar9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (*pcVar9 == ':') {
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar9 + 1,info->__data + info->__size);
        __nptr._M_p = local_78._M_dataplus._M_p;
        piVar7 = __errno_location();
        iVar2 = *piVar7;
        *piVar7 = 0;
        lVar10 = strtol(__nptr._M_p,&local_38,10);
        if (local_38 == __nptr._M_p) {
          std::__throw_invalid_argument("stoi");
        }
        else {
          uVar5 = (uint)lVar10;
          if (((int)uVar5 == lVar10) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar2;
            }
            local_7c = uVar5;
            bVar3 = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar1) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
              bVar3 = true;
            }
            break;
          }
        }
        uVar8 = std::__throw_out_of_range("stoi");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_58);
        _Unwind_Resume(uVar8);
      }
      pcVar11 = pcVar9 + 1;
      pcVar6 = info->__data + info->__size;
    } while (pcVar11 != pcVar6);
    if (bVar3) {
      bVar12 = true;
      std::
      vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>>>
      ::
      emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int&>
                ((vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>>>
                  *)&local_40->expect_vars,&local_58,&local_7c);
    }
    else {
LAB_001a1478:
      bVar12 = false;
    }
  }
LAB_001a147b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return bVar12;
}

Assistant:

bool Options::push_expect_var(const string_view& info)
{
    std::vector<std::string> names;
    optional<uint32_t> index;

    try
    {
        for(auto it = info.begin(); it != info.end(); )
        {
            auto beg_name = it;
            auto end_name = std::find_if(beg_name, info.end(), [](char c) { return c == ',' || c == ':'; });

            if(end_name == info.end() || beg_name == end_name)
                return false;

            names.emplace_back(std::string(beg_name, end_name));
            if(*end_name == ':')
            {
                index = std::stoi(std::string(end_name+1, info.end()));
                break;
            }

            it = std::next(end_name);
        }
    }
    catch(const std::logic_error&)
    {
        return false;
    }

    if(index)
    {
        this->expect_vars.emplace_back(std::move(names), *index);
        return true;
    }

    return false;
}